

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  ulong uVar1;
  undefined8 *__src;
  undefined8 *__src_00;
  char cVar2;
  ulong uVar3;
  size_t __n;
  size_t __n_00;
  uchar s_1 [33];
  uchar r_1 [33];
  secp256k1_scalar s;
  secp256k1_scalar r;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  
  __src_00 = &local_d8;
  if (output == (uchar *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_3();
  }
  else if (outputlen == (size_t *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_2();
  }
  else {
    if (sig != (secp256k1_ecdsa_signature *)0x0) {
      local_58.d[0] = *(uint64_t *)sig->data;
      local_58.d[1] = *(uint64_t *)(sig->data + 8);
      local_58.d[2] = *(uint64_t *)(sig->data + 0x10);
      local_58.d[3] = *(uint64_t *)(sig->data + 0x18);
      local_78.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_78.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_78.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_78.d[3] = *(uint64_t *)(sig->data + 0x38);
      local_88[0] = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8[0] = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      secp256k1_scalar_get_b32((uchar *)((long)&local_a8 + 1),&local_58);
      secp256k1_scalar_get_b32((uchar *)((long)&local_d8 + 1),&local_78);
      __n = 0x21;
      __src = &local_a8;
      cVar2 = (char)local_a8;
      do {
        if ((cVar2 != '\0') || (cVar2 = *(char *)((long)__src + 1), cVar2 < '\0'))
        goto LAB_00452a56;
        __n = __n - 1;
        __src = (undefined8 *)((long)__src + 1);
      } while (__n != 1);
      __n = 1;
      __src = (undefined8 *)local_88;
LAB_00452a56:
      __n_00 = 0x21;
      cVar2 = (char)local_d8;
      do {
        if ((cVar2 != '\0') || (cVar2 = *(char *)((long)__src_00 + 1), cVar2 < '\0'))
        goto LAB_00452a88;
        __n_00 = __n_00 - 1;
        __src_00 = (undefined8 *)((long)__src_00 + 1);
      } while (__n_00 != 1);
      __n_00 = 1;
      __src_00 = (undefined8 *)local_b8;
LAB_00452a88:
      uVar3 = __n + __n_00 + 6;
      uVar1 = *outputlen;
      *outputlen = uVar3;
      if (uVar1 < uVar3) {
        return 0;
      }
      *output = '0';
      output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
      output[2] = '\x02';
      output[3] = (uchar)__n;
      memcpy(output + 4,__src,__n);
      output[__n + 4] = '\x02';
      output[__n + 5] = (uchar)__n_00;
      memcpy(output + __n + 6,__src_00,__n_00);
      return 1;
    }
    secp256k1_ecdsa_signature_serialize_der_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}